

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

void __thiscall CLI::App::increment_parsed(App *this)

{
  bool bVar1;
  App *this_00;
  iterator __lhs;
  element_type *this_01;
  long in_RDI;
  App_p *sub;
  iterator __end1;
  iterator __begin1;
  vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_> *__range1;
  vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>
  *in_stack_ffffffffffffffd8;
  __normal_iterator<std::shared_ptr<CLI::App>_*,_std::vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>_>
  local_18;
  
  *(int *)(in_RDI + 0x2e4) = *(int *)(in_RDI + 0x2e4) + 1;
  this_00 = (App *)(in_RDI + 0x2c0);
  local_18._M_current =
       (shared_ptr<CLI::App> *)
       std::vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>::begin
                 (in_stack_ffffffffffffffd8);
  __lhs = std::vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>::end
                    (in_stack_ffffffffffffffd8);
  while (bVar1 = __gnu_cxx::
                 operator==<std::shared_ptr<CLI::App>_*,_std::vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>_>
                           ((__normal_iterator<std::shared_ptr<CLI::App>_*,_std::vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>_>
                             *)__lhs._M_current,
                            (__normal_iterator<std::shared_ptr<CLI::App>_*,_std::vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>_>
                             *)in_stack_ffffffffffffffd8), ((bVar1 ^ 0xffU) & 1) != 0) {
    in_stack_ffffffffffffffd8 =
         (vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_> *)
         __gnu_cxx::
         __normal_iterator<std::shared_ptr<CLI::App>_*,_std::vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>_>
         ::operator*(&local_18);
    this_01 = std::__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                         0x1ab834);
    get_name_abi_cxx11_(this_01);
    bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1ab844
                      );
    if (bVar1) {
      std::__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x1ab853
                );
      increment_parsed(this_00);
    }
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<CLI::App>_*,_std::vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>_>
    ::operator++(&local_18);
  }
  return;
}

Assistant:

CLI11_INLINE void App::increment_parsed() {
    ++parsed_;
    for(App_p &sub : subcommands_) {
        if(sub->get_name().empty())
            sub->increment_parsed();
    }
}